

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::ConflictPoolPropagation::propagateConflict
          (ConflictPoolPropagation *this,HighsInt conflict)

{
  byte *pbVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pointer puVar6;
  HighsDomain *pHVar7;
  HighsConflictPool *pHVar8;
  pointer ppVar9;
  _Map_pointer ppCVar10;
  pointer psVar11;
  int *piVar12;
  pointer pWVar13;
  pointer piVar14;
  HighsInt HVar15;
  HighsBoundType HVar16;
  pointer pHVar17;
  size_type sVar18;
  Reason RVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  vector<int,_std::allocator<int>_> *pvVar23;
  uint uVar24;
  byte bVar25;
  HighsBoundType *pHVar26;
  ulong uVar27;
  Reason reason;
  pointer pWVar28;
  HighsDomainChange HVar29;
  array<int,_2UL> inactive;
  int local_40 [2];
  double local_38;
  
  pbVar1 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start + conflict;
  *pbVar1 = *pbVar1 & 0xb;
  puVar6 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (1 < puVar6[conflict]) {
    return;
  }
  pHVar7 = this->domain;
  if (pHVar7->infeasible_ != false) {
    return;
  }
  pHVar8 = this->conflictpool_;
  ppVar9 = (pHVar8->conflictRanges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar24 = ppVar9[conflict].first;
  uVar21 = (ulong)(int)uVar24;
  if (uVar21 == 0xffffffffffffffff) {
    unlinkWatchedLiteral(this,conflict * 2);
    unlinkWatchedLiteral(this,conflict * 2 + 1);
    return;
  }
  uVar3 = ppVar9[conflict].second;
  if (uVar24 == uVar3) {
    puVar6[conflict] = '\0';
  }
  else {
    uVar24 = conflict * 2;
    pWVar28 = (this->watchedLiterals_).
              super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
              ._M_impl.super__Vector_impl_data._M_start + (int)uVar24;
    pHVar26 = &(pHVar8->conflictEntries_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21].boundtype;
    bVar25 = 0;
    do {
      if (*pHVar26 == kLower) {
        if ((pHVar7->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(int)pHVar26[-1]] <
            ((HighsDomainChange *)(pHVar26 + -3))->boundval) goto LAB_002906b4;
      }
      else if (((HighsDomainChange *)(pHVar26 + -3))->boundval <
               (pHVar7->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)pHVar26[-1]]) {
LAB_002906b4:
        uVar27 = (ulong)bVar25;
        bVar25 = bVar25 + 1;
        local_40[uVar27] = (int)uVar21;
        if (bVar25 == 2) {
          puVar6[conflict] = '\x02';
          goto LAB_002906fa;
        }
      }
      uVar20 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar20;
      pHVar26 = pHVar26 + 4;
    } while (uVar3 != uVar20);
    puVar6[conflict] = bVar25;
    if (bVar25 == 2) {
LAB_002906fa:
      lVar22 = (long)local_40[0];
      pHVar17 = (pHVar8->conflictEntries_).
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((pWVar28->domchg).boundtype == pHVar17[lVar22].boundtype) &&
         (pHVar17 = pHVar17 + lVar22, (pWVar28->domchg).column == pHVar17->column)) {
        dVar2 = (pWVar28->domchg).boundval;
        if ((dVar2 == pHVar17->boundval) && (!NAN(dVar2) && !NAN(pHVar17->boundval)))
        goto LAB_00290788;
      }
      unlinkWatchedLiteral(this,uVar24);
      pHVar17 = (pHVar8->conflictEntries_).
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_start + lVar22;
      HVar15 = pHVar17->column;
      HVar16 = pHVar17->boundtype;
      (pWVar28->domchg).boundval = pHVar17->boundval;
      (pWVar28->domchg).column = HVar15;
      (pWVar28->domchg).boundtype = HVar16;
      pWVar13 = (this->watchedLiterals_).
                super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar4 = pWVar13[(int)uVar24].domchg.column;
      pvVar23 = &this->colUpperWatched_;
      if (pWVar13[(int)uVar24].domchg.boundtype == kLower) {
        pvVar23 = &this->colLowerWatched_;
      }
      piVar14 = (pvVar23->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pWVar13[(int)uVar24].prev = -1;
      iVar5 = piVar14[iVar4];
      pWVar13[(int)uVar24].next = iVar5;
      if ((long)iVar5 != -1) {
        pWVar13[iVar5].prev = uVar24;
        piVar14[iVar4] = uVar24;
      }
LAB_00290788:
      lVar22 = (long)local_40[1];
      pHVar17 = (pHVar8->conflictEntries_).
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pWVar28[1].domchg.boundtype == pHVar17[lVar22].boundtype) &&
         (pHVar17 = pHVar17 + lVar22, pWVar28[1].domchg.column == pHVar17->column)) {
        dVar2 = pWVar28[1].domchg.boundval;
        if ((dVar2 == pHVar17->boundval) && (!NAN(dVar2) && !NAN(pHVar17->boundval))) {
          return;
        }
      }
      uVar24 = uVar24 | 1;
      unlinkWatchedLiteral(this,uVar24);
      pHVar17 = (pHVar8->conflictEntries_).
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_start + lVar22;
      HVar15 = pHVar17->column;
      HVar16 = pHVar17->boundtype;
      pWVar28[1].domchg.boundval = pHVar17->boundval;
      pWVar28[1].domchg.column = HVar15;
      pWVar28[1].domchg.boundtype = HVar16;
      pWVar28 = (this->watchedLiterals_).
                super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar4 = pWVar28[(int)uVar24].domchg.column;
      pvVar23 = &this->colLowerWatched_;
      if (pWVar28[(int)uVar24].domchg.boundtype != kLower) {
        pvVar23 = &this->colUpperWatched_;
      }
      piVar14 = (pvVar23->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pWVar28[(int)uVar24].prev = -1;
      iVar5 = piVar14[iVar4];
      pWVar28[(int)uVar24].next = iVar5;
      if ((long)iVar5 == -1) {
        return;
      }
      pWVar28[iVar5].prev = uVar24;
      piVar14[iVar4] = uVar24;
      return;
    }
    if (bVar25 == 1) {
      pHVar7 = this->domain;
      HVar29 = flip(pHVar7,(pHVar8->conflictEntries_).
                           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_40[0]);
      uVar21 = HVar29._8_8_;
      local_38 = HVar29.boundval;
      if (uVar21 >> 0x20 == 0) {
        if (local_38 <=
            (pHVar7->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[HVar29.column]) {
          return;
        }
      }
      else if ((pHVar7->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[HVar29.column] <= local_38) {
        return;
      }
      sVar18 = std::
               deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
               ::size(&pHVar7->cutpoolpropagation);
      reason.index = conflict;
      reason.type = (int)sVar18 + this->conflictpoolindex;
      HVar29.column = (int)uVar21;
      HVar29.boundtype = (int)(uVar21 >> 0x20);
      HVar29.boundval = local_38;
      changeBound(pHVar7,HVar29,reason);
      goto LAB_002905ff;
    }
    if (bVar25 != 0) {
      return;
    }
  }
  pHVar7 = this->domain;
  pHVar7->infeasible_ = true;
  ppCVar10 = (pHVar7->cutpoolpropagation).
             super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
  RVar19.type = (int)((ulong)((long)(pHVar7->cutpoolpropagation).
                                    super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_last -
                             (long)(pHVar7->cutpoolpropagation).
                                   super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) *
                0x38e38e39 +
                (int)((ulong)((long)(pHVar7->cutpoolpropagation).
                                    super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                             (long)(pHVar7->cutpoolpropagation).
                                   super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) *
                0x38e38e39 +
                ((int)((ulong)((long)ppCVar10 -
                              (long)(pHVar7->cutpoolpropagation).
                                    super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
                (uint)(ppCVar10 == (_Map_pointer)0x0)) * 3 + this->conflictpoolindex;
  RVar19.index = conflict;
  pHVar7->infeasible_reason = RVar19;
  pHVar7 = this->domain;
  pHVar7->infeasible_pos =
       (HighsInt)
       ((ulong)((long)(pHVar7->domchgstack_).
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pHVar7->domchgstack_).
                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 4);
LAB_002905ff:
  psVar11 = (this->conflictpool_->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar22 = (long)psVar11[conflict];
  if (0 < lVar22) {
    piVar12 = (this->conflictpool_->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    piVar12[lVar22] = piVar12[lVar22] + -1;
    *piVar12 = *piVar12 + 1;
    psVar11[conflict] = 0;
  }
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::propagateConflict(
    HighsInt conflict) {
  // remove propagate flag, but keep watched and deleted information
  conflictFlag_[conflict] &= (3 | 8);
  // if two inactive literals are watched or conflict has been deleted skip
  if (conflictFlag_[conflict] >= 2) return;

  if (domain->infeasible_) return;

  const std::vector<HighsDomainChange>& entries =
      conflictpool_->getConflictEntryVector();
  HighsInt start = conflictpool_->getConflictRanges()[conflict].first;
  if (start == -1) {
    unlinkWatchedLiteral(2 * conflict);
    unlinkWatchedLiteral(2 * conflict + 1);
    return;
  }
  HighsInt end = conflictpool_->getConflictRanges()[conflict].second;

  WatchedLiteral* watched = watchedLiterals_.data() + 2 * conflict;

  std::array<HighsInt, 2> inactive;
  uint8_t numInactive = 0;
  for (HighsInt i = start; i != end; ++i) {
    if (domain->isActive(entries[i])) continue;

    inactive[numInactive++] = i;
    if (numInactive == 2) break;
  }

  conflictFlag_[conflict] = numInactive;

  switch (numInactive) {
    case 0:
      assert(!domain->infeasible_);
      domain->mipsolver->mipdata_->debugSolution.nodePruned(*domain);
      domain->infeasible_ = true;
      domain->infeasible_reason = Reason::cut(
          domain->cutpoolpropagation.size() + conflictpoolindex, conflict);
      domain->infeasible_pos = domain->domchgstack_.size();
      conflictpool_->resetAge(conflict);
      // printf("conflict propagation found infeasibility\n");
      break;
    case 1: {
      HighsDomainChange domchg = domain->flip(entries[inactive[0]]);
      if (!domain->isActive(domchg)) {
        domain->changeBound(
            domain->flip(entries[inactive[0]]),
            Reason::cut(domain->cutpoolpropagation.size() + conflictpoolindex,
                        conflict));
        conflictpool_->resetAge(conflict);
      }
      // printf("conflict propagation found bound change\n");
      break;
    }
    case 2: {
      if (watched[0].domchg != entries[inactive[0]]) {
        unlinkWatchedLiteral(2 * conflict);
        watched[0].domchg = entries[inactive[0]];
        linkWatchedLiteral(2 * conflict);
      }

      if (watched[1].domchg != entries[inactive[1]]) {
        unlinkWatchedLiteral(2 * conflict + 1);
        watched[1].domchg = entries[inactive[1]];
        linkWatchedLiteral(2 * conflict + 1);
      }

      return;
    }
  }
}